

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O2

void secp256k1_scalar_from_signed62(secp256k1_scalar *r,secp256k1_modinv64_signed62 *a)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  uVar1 = a->v[1];
  uVar2 = a->v[2];
  uVar3 = a->v[3];
  lVar4 = a->v[4];
  r->d[0] = uVar1 << 0x3e | a->v[0];
  r->d[1] = uVar2 << 0x3c | uVar1 >> 2;
  r->d[2] = uVar3 << 0x3a | uVar2 >> 4;
  r->d[3] = lVar4 << 0x38 | uVar3 >> 6;
  return;
}

Assistant:

static void secp256k1_scalar_from_signed62(secp256k1_scalar *r, const secp256k1_modinv64_signed62 *a) {
    const uint64_t a0 = a->v[0], a1 = a->v[1], a2 = a->v[2], a3 = a->v[3], a4 = a->v[4];

    /* The output from secp256k1_modinv64{_var} should be normalized to range [0,modulus), and
     * have limbs in [0,2^62). The modulus is < 2^256, so the top limb must be below 2^(256-62*4).
     */
    VERIFY_CHECK(a0 >> 62 == 0);
    VERIFY_CHECK(a1 >> 62 == 0);
    VERIFY_CHECK(a2 >> 62 == 0);
    VERIFY_CHECK(a3 >> 62 == 0);
    VERIFY_CHECK(a4 >> 8 == 0);

    r->d[0] = a0      | a1 << 62;
    r->d[1] = a1 >> 2 | a2 << 60;
    r->d[2] = a2 >> 4 | a3 << 58;
    r->d[3] = a3 >> 6 | a4 << 56;

    SECP256K1_SCALAR_VERIFY(r);
}